

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::commit_conf(raft_server *this,ulong idx_to_commit,ptr<log_entry> *le)

{
  bool bVar1;
  int iVar2;
  __int_type_conflict leader_id;
  element_type *peVar3;
  ulong uVar4;
  ulong uVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  undefined8 in_RSI;
  long in_RDI;
  uint64_t log_idx;
  Param param;
  ptr<cluster_config> cur_conf;
  ptr<cluster_config> new_conf;
  unique_lock<std::recursive_mutex> guard;
  ptr<cluster_config> *in_stack_000009f0;
  raft_server *in_stack_000009f8;
  Param *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Type type;
  cb_func *in_stack_fffffffffffffed8;
  log_entry *in_stack_fffffffffffffee0;
  raft_server *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined8 local_b8;
  Param local_b0;
  string local_98 [32];
  string local_78 [48];
  undefined1 local_48 [56];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (mutex_type *)in_stack_fffffffffffffec8);
  std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x26685d);
  log_entry::get_buf(in_stack_fffffffffffffee0);
  nuraft::buffer::pos((buffer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (size_t)in_stack_fffffffffffffee8);
  std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x266889);
  log_entry::get_buf(in_stack_fffffffffffffee0);
  cluster_config::deserialize((buffer *)in_stack_fffffffffffffee8);
  get_config(in_stack_fffffffffffffee8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2668eb);
    iVar2 = (*peVar7->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x26691b);
      peVar3 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x26692d);
      uVar4 = cluster_config::get_log_idx(peVar3);
      peVar3 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x266949);
      uVar5 = cluster_config::get_log_idx(peVar3);
      msg_if_given_abi_cxx11_
                ((char *)local_78,"config at index %lu is committed, prev config log idx %lu",uVar4,
                 uVar5);
      (*peVar7->_vptr_logger[8])
                (peVar7,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_conf",0x19a,local_78);
      std::__cxx11::string::~string(local_78);
    }
  }
  *(undefined1 *)(in_RDI + 0xe9) = 0;
  peVar3 = std::
           __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x266a44);
  uVar4 = cluster_config::get_log_idx(peVar3);
  peVar3 = std::
           __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x266a60);
  uVar5 = cluster_config::get_log_idx(peVar3);
  if (uVar4 < uVar5) {
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x266a8f);
    peVar6 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x266a97);
    peVar3 = std::
             __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    (*peVar6->_vptr_state_mgr[3])(peVar6,peVar3);
    reconfigure(in_stack_000009f8,in_stack_000009f0);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x266b00);
      iVar2 = (*peVar7->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x266b30);
        peVar3 = std::
                 __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x266b42);
        uVar4 = cluster_config::get_log_idx(peVar3);
        peVar3 = std::
                 __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x266b5e);
        in_stack_fffffffffffffed8 = (cb_func *)cluster_config::get_log_idx(peVar3);
        msg_if_given_abi_cxx11_
                  ((char *)local_98,"skipped config %lu, latest config %lu",uVar4,
                   in_stack_fffffffffffffed8);
        (*peVar7->_vptr_logger[8])
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_conf",0x1a3,local_98);
        std::__cxx11::string::~string(local_98);
      }
    }
  }
  type = *(Type *)(in_RDI + 0x38);
  leader_id = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffed8);
  cb_func::Param::Param(&local_b0,type,leader_id,-1,(void *)0x0);
  local_b8 = local_10;
  local_b0.ctx = &local_b8;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x266c5c);
  cb_func::call(in_stack_fffffffffffffed8,type,in_stack_fffffffffffffec8);
  peVar8 = std::__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x266c88);
  (*peVar8->_vptr_state_machine[4])(peVar8,local_10,local_48);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x266cb3);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x266cc0);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)CONCAT44(type,in_stack_fffffffffffffed0));
  return;
}

Assistant:

void raft_server::commit_conf(ulong idx_to_commit,
                              ptr<log_entry>& le) {
    recur_lock(lock_);
    le->get_buf().pos(0);
    ptr<cluster_config> new_conf =
        cluster_config::deserialize(le->get_buf());

    ptr<cluster_config> cur_conf = get_config();
    p_in( "config at index %" PRIu64 " is committed, prev config log idx %" PRIu64 "",
          new_conf->get_log_idx(), cur_conf->get_log_idx() );

    config_changing_ = false;
    if (cur_conf->get_log_idx() < new_conf->get_log_idx()) {
        // WARNING: Should not overwrite newer config with older one.
        ctx_->state_mgr_->save_config(*new_conf);
        reconfigure(new_conf);
    } else {
        p_in( "skipped config %" PRIu64 ", latest config %" PRIu64 "",
              new_conf->get_log_idx(), cur_conf->get_log_idx() );
    }

    cb_func::Param param(id_, leader_);
    uint64_t log_idx = idx_to_commit;
    param.ctx = &log_idx;
    ctx_->cb_func_.call(cb_func::NewConfig, &param);

    state_machine_->commit_config(idx_to_commit, new_conf);

    // Modified by Jung-Sang Ahn, May 18 2018:
    //   This causes an endless catch-up issue when we add a new node,
    //   as configuration always has itself in it.
    //   Instead, we can clear catch-up flag when this node receives
    //   normal append_entries() request, as receiving log entry
    //   means that catch-up process is already done.
    //
    // if (catching_up_ && new_conf->get_server(id_) != nilptr) {
    //     p_in("this server is committed as one of cluster members");
    //     catching_up_ = false;
    // }
}